

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void set_node_pos(c2m_ctx_t c2m_ctx,node_t_conflict n,pos_t pos)

{
  uint uVar1;
  size_t sVar2;
  node_t_conflict n_local;
  c2m_ctx_t c2m_ctx_local;
  pos_t pos_local;
  
  while( true ) {
    uVar1 = n->uid;
    sVar2 = VARR_pos_tlength(c2m_ctx->node_positions);
    if (uVar1 < sVar2) break;
    VARR_pos_tpush(c2m_ctx->node_positions,(pos_t)(ZEXT816((ulong)0xffffffffffffffff) << 0x40));
  }
  VARR_pos_tset(c2m_ctx->node_positions,(ulong)n->uid,pos);
  return;
}

Assistant:

static void set_node_pos (c2m_ctx_t c2m_ctx, node_t n, pos_t pos) {
  while (n->uid >= VARR_LENGTH (pos_t, node_positions)) VARR_PUSH (pos_t, node_positions, no_pos);
  VARR_SET (pos_t, node_positions, n->uid, pos);
}